

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_sad_avx2.c
# Opt level: O2

uint aom_highbd_sad16x8_avg_avx2
               (uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint8_t *second_pred)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i sad;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  local_80 = 0;
  lStack_78 = 0;
  lStack_70 = 0;
  lStack_68 = 0;
  sad16x4((uint16_t *)((long)src * 2),src_stride,(uint16_t *)((long)ref * 2),ref_stride,
          (uint16_t *)((long)second_pred * 2),(__m256i *)&local_80);
  sad16x4((uint16_t *)((long)(src_stride * 4) * 2 + (long)src * 2),src_stride,
          (uint16_t *)((long)(ref_stride * 4) * 2 + (long)ref * 2),ref_stride,
          (uint16_t *)((long)second_pred * 2 + 0x80),(__m256i *)&local_80);
  auVar2._8_8_ = lStack_78;
  auVar2._0_8_ = local_80;
  auVar2._16_8_ = lStack_70;
  auVar2._24_8_ = lStack_68;
  auVar3 = vpsrldq_avx2(auVar2,8);
  auVar2 = vpaddd_avx2(auVar3,auVar2);
  auVar1 = vpaddd_avx(auVar2._16_16_,auVar2._0_16_);
  auVar1 = vphaddd_avx(auVar1,auVar1);
  return auVar1._0_4_;
}

Assistant:

unsigned int aom_highbd_sad16x8_avg_avx2(const uint8_t *src, int src_stride,
                                         const uint8_t *ref, int ref_stride,
                                         const uint8_t *second_pred) {
  __m256i sad = _mm256_setzero_si256();
  uint16_t *srcp = CONVERT_TO_SHORTPTR(src);
  uint16_t *refp = CONVERT_TO_SHORTPTR(ref);
  uint16_t *secp = CONVERT_TO_SHORTPTR(second_pred);

  sad16x4(srcp, src_stride, refp, ref_stride, secp, &sad);

  // Next 4 rows
  srcp += src_stride << 2;
  refp += ref_stride << 2;
  secp += 64;
  sad16x4(srcp, src_stride, refp, ref_stride, secp, &sad);
  return get_sad_from_mm256_epi32(&sad);
}